

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void d68000_andi_to_sr(m68k_info *info)

{
  ulong uVar1;
  double dVar2;
  
  uVar1 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
  dVar2 = 2.15857280668041e-319;
  if (uVar1 + 2 <= info->code_len) {
    dVar2 = (double)(ulong)(ushort)(*(ushort *)(info->code + uVar1) << 8 |
                                   *(ushort *)(info->code + uVar1) >> 8);
  }
  info->pc = info->pc + 2;
  MCInst_setOpcode(info->inst,8);
  (info->extension).op_count = '\x02';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x2;
  (info->extension).operands[0].type = M68K_OP_IMM;
  (info->extension).operands[0].address_mode = M68K_AM_IMMEDIATE;
  (info->extension).operands[0].field_0.dimm = dVar2;
  (info->extension).operands[1].address_mode = M68K_AM_NONE;
  (info->extension).operands[1].field_0.simm = 3.64338e-44;
  return;
}

Assistant:

static void d68000_andi_to_sr(m68k_info *info)
{
	build_imm_special_reg(info, M68K_INS_ANDI, read_imm_16(info), 2, M68K_REG_SR);
}